

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

void __thiscall glslang::TProgram::~TProgram(TProgram *this)

{
  ~TProgram(this);
  operator_delete(this,0x1f8);
  return;
}

Assistant:

TProgram::~TProgram()
{
    delete infoSink;
    delete reflection;

    for (int s = 0; s < EShLangCount; ++s)
        if (newedIntermediate[s])
            delete intermediate[s];

    delete pool;
}